

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_splice_list_Test::TestBody(IntrusiveListTest_splice_list_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  __off64_t *in_R8;
  size_t in_R9;
  vector<int,_std::allocator<int>_> local_2b0;
  allocator<int> local_295;
  int local_294 [9];
  iterator local_270;
  size_type local_268;
  vector<int,_std::allocator<int>_> local_260;
  iterator local_248;
  iterator local_238;
  allocator<int> local_225;
  int local_224;
  iterator local_220;
  size_type local_218;
  vector<int,_std::allocator<int>_> local_210;
  undefined1 local_1f8 [8];
  TestObjectList list4;
  allocator<int> local_1c1;
  int local_1c0 [8];
  iterator local_1a0;
  size_type local_198;
  vector<int,_std::allocator<int>_> local_190;
  iterator local_178;
  allocator<int> local_165;
  int local_164 [3];
  iterator local_158;
  size_type local_150;
  vector<int,_std::allocator<int>_> local_148;
  undefined1 local_130 [8];
  TestObjectList list3;
  allocator<int> local_fd;
  int local_fc [5];
  iterator local_e8;
  size_type local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  iterator local_c0;
  allocator<int> local_a9;
  int local_a8 [2];
  iterator local_a0;
  size_type local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  TestObjectList list2;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list1;
  IntrusiveListTest_splice_list_Test *this_local;
  
  list2.size_._4_4_ = 1;
  list1.size_ = (size_t)this;
  std::allocator<int>::allocator((allocator<int> *)((long)&list2.size_ + 3));
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)((long)&list2.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,__l_05,(allocator_type *)((long)&list2.size_ + 3));
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list2.size_ + 3));
  local_a8[0] = 100;
  local_a8[1] = 200;
  local_a0 = local_a8;
  local_98 = 2;
  std::allocator<int>::allocator(&local_a9);
  __l_04._M_len = local_98;
  __l_04._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_04,&local_a9);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::NewList
            ((TestObjectList *)local_78,&this->super_IntrusiveListTest,&local_90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  std::allocator<int>::~allocator(&local_a9);
  local_c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_c0.list_,
             (__off64_t *)local_c0.node_,(int)local_78,in_R8,in_R9,(uint)this);
  local_fc[0] = 100;
  local_fc[1] = 200;
  local_fc[2] = 1;
  local_fc[3] = 2;
  local_fc[4] = 3;
  local_e8 = local_fc;
  local_e0 = 5;
  std::allocator<int>::allocator(&local_fd);
  __l_03._M_len = local_e0;
  __l_03._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,__l_03,&local_fd);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
  std::allocator<int>::~allocator(&local_fd);
  memset(&list3.size_,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&list3.size_);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_78,
             (vector<int,_std::allocator<int>_> *)&list3.size_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&list3.size_)
  ;
  local_164[0] = 500;
  local_164[1] = 600;
  local_164[2] = 700;
  local_158 = local_164;
  local_150 = 3;
  std::allocator<int>::allocator(&local_165);
  __l_02._M_len = local_150;
  __l_02._M_array = local_158;
  std::vector<int,_std::allocator<int>_>::vector(&local_148,__l_02,&local_165);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::NewList
            ((TestObjectList *)local_130,&this->super_IntrusiveListTest,&local_148);
  std::vector<int,_std::allocator<int>_>::~vector(&local_148);
  std::allocator<int>::~allocator(&local_165);
  local_178 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_178.list_,
             (__off64_t *)local_178.node_,(int)local_130,in_R8,in_R9,(uint)this);
  local_1c0[0] = 100;
  local_1c0[1] = 200;
  local_1c0[2] = 1;
  local_1c0[3] = 2;
  local_1c0[4] = 3;
  local_1c0[5] = 500;
  local_1c0[6] = 600;
  local_1c0[7] = 700;
  local_1a0 = local_1c0;
  local_198 = 8;
  std::allocator<int>::allocator(&local_1c1);
  __l_01._M_len = local_198;
  __l_01._M_array = local_1a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_190,__l_01,&local_1c1);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_190);
  std::vector<int,_std::allocator<int>_>::~vector(&local_190);
  std::allocator<int>::~allocator(&local_1c1);
  memset(&list4.size_,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&list4.size_);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_130,
             (vector<int,_std::allocator<int>_> *)&list4.size_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&list4.size_)
  ;
  local_224 = 400;
  local_220 = &local_224;
  local_218 = 1;
  std::allocator<int>::allocator(&local_225);
  __l_00._M_len = local_218;
  __l_00._M_array = local_220;
  std::vector<int,_std::allocator<int>_>::vector(&local_210,__l_00,&local_225);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::NewList
            ((TestObjectList *)local_1f8,&this->super_IntrusiveListTest,&local_210);
  std::vector<int,_std::allocator<int>_>::~vector(&local_210);
  std::allocator<int>::~allocator(&local_225);
  local_248 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_238 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_248,4);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_238.list_,
             (__off64_t *)local_238.node_,(int)local_1f8,in_R8,in_R9,(uint)this);
  memcpy(local_294,&DAT_00309088,0x24);
  local_270 = local_294;
  local_268 = 9;
  std::allocator<int>::allocator(&local_295);
  __l._M_len = local_268;
  __l._M_array = local_270;
  std::vector<int,_std::allocator<int>_>::vector(&local_260,__l,&local_295);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_260);
  std::vector<int,_std::allocator<int>_>::~vector(&local_260);
  std::allocator<int>::~allocator(&local_295);
  memset(&local_2b0,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_2b0);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_1f8,&local_2b0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2b0);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_1f8);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_130);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2);
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3);
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});
  AssertListEq(list3, {});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4);
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
  AssertListEq(list4, {});
}